

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdpostct.c
# Opt level: O3

void post_process_2pass(j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION *in_row_group_ctr,
                       JDIMENSION in_row_groups_avail,JSAMPARRAY output_buf,JDIMENSION *out_row_ctr,
                       JDIMENSION out_rows_avail)

{
  int *piVar1;
  jpeg_d_post_controller *pjVar2;
  JSAMPARRAY ppJVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  pjVar2 = cinfo->post;
  uVar4 = *(uint *)&pjVar2[2].post_process_data;
  if (uVar4 == 0) {
    ppJVar3 = (*cinfo->mem->access_virt_sarray)
                        ((j_common_ptr)cinfo,(jvirt_sarray_ptr)pjVar2[1].start_pass,
                         *(JDIMENSION *)((long)&pjVar2[2].start_pass + 4),
                         *(JDIMENSION *)&pjVar2[2].start_pass,0);
    pjVar2[1].post_process_data =
         (_func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_ptr_JDIMENSION_JSAMPARRAY_JDIMENSION_ptr_JDIMENSION
          *)ppJVar3;
    uVar4 = *(uint *)&pjVar2[2].post_process_data;
  }
  else {
    ppJVar3 = (JSAMPARRAY)pjVar2[1].post_process_data;
  }
  uVar5 = *(int *)&pjVar2[2].start_pass - uVar4;
  uVar6 = out_rows_avail - *out_row_ctr;
  if (uVar5 < uVar6) {
    uVar6 = uVar5;
  }
  uVar5 = cinfo->output_height - *(int *)((long)&pjVar2[2].start_pass + 4);
  if (uVar6 < uVar5) {
    uVar5 = uVar6;
  }
  (*cinfo->cquantize->color_quantize)(cinfo,ppJVar3 + uVar4,output_buf + *out_row_ctr,uVar5);
  *out_row_ctr = *out_row_ctr + uVar5;
  uVar5 = uVar5 + *(int *)&pjVar2[2].post_process_data;
  *(uint *)&pjVar2[2].post_process_data = uVar5;
  if (*(uint *)&pjVar2[2].start_pass <= uVar5) {
    piVar1 = (int *)((long)&pjVar2[2].start_pass + 4);
    *piVar1 = *piVar1 + *(uint *)&pjVar2[2].start_pass;
    *(undefined4 *)&pjVar2[2].post_process_data = 0;
  }
  return;
}

Assistant:

METHODDEF(void)
post_process_2pass (j_decompress_ptr cinfo,
		    JSAMPIMAGE input_buf, JDIMENSION *in_row_group_ctr,
		    JDIMENSION in_row_groups_avail,
		    JSAMPARRAY output_buf, JDIMENSION *out_row_ctr,
		    JDIMENSION out_rows_avail)
{
  my_post_ptr post = (my_post_ptr) cinfo->post;
  JDIMENSION num_rows, max_rows;

  /* Reposition virtual buffer if at start of strip. */
  if (post->next_row == 0) {
    post->buffer = (*cinfo->mem->access_virt_sarray)
	((j_common_ptr) cinfo, post->whole_image,
	 post->starting_row, post->strip_height, FALSE);
  }

  /* Determine number of rows to emit. */
  num_rows = post->strip_height - post->next_row; /* available in strip */
  max_rows = out_rows_avail - *out_row_ctr; /* available in output area */
  if (num_rows > max_rows)
    num_rows = max_rows;
  /* We have to check bottom of image here, can't depend on upsampler. */
  max_rows = cinfo->output_height - post->starting_row;
  if (num_rows > max_rows)
    num_rows = max_rows;

  /* Quantize and emit data. */
  (*cinfo->cquantize->color_quantize) (cinfo,
		post->buffer + post->next_row, output_buf + *out_row_ctr,
		(int) num_rows);
  *out_row_ctr += num_rows;

  /* Advance if we filled the strip. */
  post->next_row += num_rows;
  if (post->next_row >= post->strip_height) {
    post->starting_row += post->strip_height;
    post->next_row = 0;
  }
}